

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

double llvm::detail::scalbn(double __x,int __n)

{
  IEEEFloat *pIVar1;
  long *in_RSI;
  undefined4 in_register_0000003c;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar2;
  double extraout_XMM0_Qa_03;
  undefined1 local_b0 [40];
  IEEEFloat local_88;
  undefined1 local_70 [40];
  IEEEFloat local_48;
  
  if ((undefined1 *)*in_RSI == semPPCDoubleDouble) {
    pIVar1 = (IEEEFloat *)(in_RSI[1] + 8);
    if (*(undefined1 **)(in_RSI[1] + 8) == semPPCDoubleDouble) {
      DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)&local_48,(DoubleAPFloat *)pIVar1);
      dVar2 = extraout_XMM0_Qa_00;
    }
    else {
      IEEEFloat::IEEEFloat(&local_48,pIVar1);
      dVar2 = extraout_XMM0_Qa;
    }
    llvm::scalbn(dVar2,(int)local_b0);
    pIVar1 = (IEEEFloat *)(in_RSI[1] + 0x28);
    if (*(undefined1 **)(in_RSI[1] + 0x28) == semPPCDoubleDouble) {
      DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)&local_88,(DoubleAPFloat *)pIVar1);
      dVar2 = extraout_XMM0_Qa_02;
    }
    else {
      IEEEFloat::IEEEFloat(&local_88,pIVar1);
      dVar2 = extraout_XMM0_Qa_01;
    }
    llvm::scalbn(dVar2,(int)(APFloat *)local_70);
    DoubleAPFloat::DoubleAPFloat
              ((DoubleAPFloat *)CONCAT44(in_register_0000003c,__n),
               (fltSemantics *)semPPCDoubleDouble,(APFloat *)local_b0,(APFloat *)local_70);
    APFloat::Storage::~Storage((Storage *)(local_70 + 8));
    APFloat::Storage::~Storage((Storage *)&local_88);
    APFloat::Storage::~Storage((Storage *)(local_b0 + 8));
    APFloat::Storage::~Storage((Storage *)&local_48);
    return extraout_XMM0_Qa_03;
  }
  __assert_fail("Arg.Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x112e,
                "DoubleAPFloat llvm::detail::scalbn(DoubleAPFloat, int, APFloat::roundingMode)");
}

Assistant:

DoubleAPFloat scalbn(DoubleAPFloat Arg, int Exp, APFloat::roundingMode RM) {
  assert(Arg.Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  return DoubleAPFloat(semPPCDoubleDouble, scalbn(Arg.Floats[0], Exp, RM),
                       scalbn(Arg.Floats[1], Exp, RM));
}